

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O0

Result<wallet::SelectionResult> *
wallet::CoinGrinder(vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
                   CAmount *selection_target,CAmount change_target,int max_selection_weight)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  iterator iVar6;
  iterator iVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  CAmount CVar11;
  long lVar12;
  reference pvVar13;
  reference pvVar14;
  CAmount CVar15;
  size_type sVar16;
  long in_RCX;
  long *in_RDX;
  Result<wallet::SelectionResult> *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  size_t *i_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  value_type curr_tail;
  OutputGroup *utxo;
  bool should_cut;
  bool should_shift;
  size_t curr_try;
  bool is_done;
  bool max_tx_weight_exceeded;
  int best_selection_weight;
  CAmount best_selection_amount;
  CAmount total_target;
  size_t index;
  size_t i;
  CAmount total_available;
  iterator __end1;
  iterator __begin1;
  anon_class_32_4_ac040c79 deselect_last;
  size_t next_utxo;
  int curr_weight;
  CAmount curr_amount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  int min_group_weight;
  vector<int,_std::allocator<int>_> min_tail_weight;
  vector<long,_std::allocator<long>_> lookahead;
  SelectionResult result;
  undefined7 in_stack_fffffffffffffc18;
  SelectionAlgorithm in_stack_fffffffffffffc1f;
  T *in_stack_fffffffffffffc20;
  SelectionResult *in_stack_fffffffffffffc28;
  char *in_stack_fffffffffffffc30;
  allocator_type *in_stack_fffffffffffffc38;
  size_type in_stack_fffffffffffffc40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffc48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffcb8;
  bool local_2ba;
  ulong local_2b8;
  int local_2ac;
  long local_2a8;
  ulong local_288;
  long local_280;
  size_type local_1f8;
  int local_1ec;
  long local_1e8;
  int local_1a8;
  SelectionResult local_168;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::begin
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc20);
  iVar7 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::end
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc20);
  std::
  sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,wallet::__1>
            (iVar6._M_current,iVar7._M_current);
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::allocator<long>::allocator
            ((allocator<long> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40,(allocator_type *)in_stack_fffffffffffffc38);
  std::allocator<long>::~allocator
            ((allocator<long> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
             CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::allocator<int>::allocator
            ((allocator<int> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
  std::allocator<int>::~allocator
            ((allocator<int> *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  local_280 = 0;
  local_1a8 = std::numeric_limits<int>::max();
  for (local_288 = 0;
      sVar8 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                        ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18)),
      local_288 < sVar8; local_288 = local_288 + 1) {
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc28,
                        (size_type)in_stack_fffffffffffffc20);
    *pvVar9 = local_280;
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                         (size_type)in_stack_fffffffffffffc20);
    *pvVar10 = local_1a8;
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
    OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
    inline_assertion_check<false,bool>
              ((bool *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
               (int)((ulong)in_stack_fffffffffffffc28 >> 0x20),(char *)in_stack_fffffffffffffc20,
               (char *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
    CVar11 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
    local_280 = local_280 + CVar11;
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
              ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
               in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
    in_stack_fffffffffffffcb8 =
         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::min<int>((int *)in_stack_fffffffffffffc20,
                       (int *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    local_1a8 = *(int *)&(in_stack_fffffffffffffcb8->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start;
  }
  lVar12 = *in_RDX + in_RCX;
  if (local_280 < lVar12) {
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    util::Error::Error((Error *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    util::Result<wallet::SelectionResult>::Result
              ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc28,
               (Error *)in_stack_fffffffffffffc20);
    util::Error::~Error((Error *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    local_1e8 = 0;
    local_2a8 = 2100000000000000;
    local_1ec = 0;
    bVar2 = false;
    local_1f8 = 0;
    SelectionResult::SelectionResult
              (in_stack_fffffffffffffc28,(CAmount)in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc1f);
    bVar5 = false;
    local_2b8 = 0;
    local_2ac = in_R8D;
LAB_00baf863:
    if (!bVar5) {
      bVar4 = false;
      local_2ba = false;
      pvVar13 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                          ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                           in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
      CVar11 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
      local_1e8 = local_1e8 + CVar11;
      local_1ec = local_1ec + pvVar13->m_weight;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc28,
                 (value_type_conflict5 *)in_stack_fffffffffffffc20);
      local_1f8 = local_1f8 + 1;
      local_2b8 = local_2b8 + 1;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      pvVar9 = std::vector<long,_std::allocator<long>_>::operator[]
                         ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc28,
                          (size_type)in_stack_fffffffffffffc20);
      if (local_1e8 + *pvVar9 < lVar12) {
        local_2ba = true;
      }
      else if (local_2ac < local_1ec) {
        if (in_R8D < local_1ec) {
          bVar2 = true;
        }
        pvVar13 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                            ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                             in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
        iVar1 = pvVar13->m_weight;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                             (size_type)in_stack_fffffffffffffc20);
        bVar4 = *pvVar10 < iVar1;
        local_2ba = !bVar4;
      }
      else if (local_1e8 < lVar12) {
        bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffc28);
        if (!bVar3) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                               (size_type)in_stack_fffffffffffffc20);
          iVar1 = *pvVar10;
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
          CVar11 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
          CVar15 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
          if ((long)local_2ac <
              (long)local_1ec + (long)iVar1 * (((lVar12 - local_1e8) + -1 + CVar11) / CVar15)) {
            pvVar13 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::
                      operator[]((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                                  *)in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
            iVar1 = pvVar13->m_weight;
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28,
                                 (size_type)in_stack_fffffffffffffc20);
            bVar4 = *pvVar10 < iVar1;
            local_2ba = !bVar4;
          }
        }
      }
      else {
        bVar4 = true;
        if ((local_1ec < local_2ac) || ((local_1ec == local_2ac && (local_1e8 < local_2a8)))) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
          local_2ac = local_1ec;
          local_2a8 = local_1e8;
        }
      }
      if (99999 < local_2b8) {
        SelectionResult::SetAlgoCompleted
                  ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
                   false);
        goto LAB_00bafda8;
      }
      sVar8 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                        ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                         CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      if (local_1f8 == sVar8) {
        local_2ba = true;
      }
      if (local_2ba) {
        CoinGrinder::anon_class_32_4_ac040c79::operator()
                  ((anon_class_32_4_ac040c79 *)in_stack_fffffffffffffc28);
        bVar4 = true;
      }
LAB_00bafc82:
      if (bVar4) {
        bVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           in_stack_fffffffffffffc28);
        if (bVar4) {
          bVar5 = true;
          SelectionResult::SetAlgoCompleted
                    ((SelectionResult *)
                     CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),false);
          goto LAB_00baf863;
        }
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        local_1f8 = *pvVar14;
        CoinGrinder::anon_class_32_4_ac040c79::operator()
                  ((anon_class_32_4_ac040c79 *)in_stack_fffffffffffffc28);
        bVar4 = false;
        do {
          local_1f8 = local_1f8 + 1;
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
          CVar11 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
          std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                    ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                     in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
          CVar15 = OutputGroup::GetSelectionAmount((OutputGroup *)in_stack_fffffffffffffc28);
          if (CVar11 != CVar15) goto LAB_00bafc82;
          sVar8 = local_1f8;
          sVar16 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::size
                             ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                              CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        } while (sVar8 < sVar16 - 1);
        bVar4 = true;
        goto LAB_00bafc82;
      }
      goto LAB_00baf863;
    }
LAB_00bafda8:
    SelectionResult::SetSelectionsEvaluated
              ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
               0xbafdbd);
    bVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       in_stack_fffffffffffffc28);
    if (bVar5) {
      if (bVar2) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_c8 = 0;
        uStack_c0 = 0;
        local_d8 = 0;
        uStack_d0 = 0;
        local_e8 = 0;
        uStack_e0 = 0;
        local_f8 = 0;
        uStack_f0 = 0;
        util::Error::Error((Error *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        util::Result<wallet::SelectionResult>::Result
                  ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc28,
                   (Error *)in_stack_fffffffffffffc20);
        util::Error::~Error((Error *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      }
    }
    else {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc20)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc20)
      ;
      while (bVar5 = __gnu_cxx::
                     operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc28,
                                (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                 *)in_stack_fffffffffffffc20), ((bVar5 ^ 0xffU) & 1) != 0) {
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                     *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
        std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::operator[]
                  ((vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *)
                   in_stack_fffffffffffffc28,(size_type)in_stack_fffffffffffffc20);
        SelectionResult::AddInput
                  (in_stack_fffffffffffffc28,(OutputGroup *)in_stack_fffffffffffffc20);
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
      }
      in_stack_fffffffffffffc28 = &local_168;
      SelectionResult::SelectionResult(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      util::Result<wallet::SelectionResult>::Result
                ((Result<wallet::SelectionResult> *)in_stack_fffffffffffffc28,
                 in_stack_fffffffffffffc20);
      SelectionResult::~SelectionResult
                ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    }
    SelectionResult::~SelectionResult
              ((SelectionResult *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc28);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc28);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)in_stack_fffffffffffffc28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<SelectionResult> CoinGrinder(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, CAmount change_target, int max_selection_weight)
{
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending_effval_weight);
    // The sum of UTXO amounts after this UTXO index, e.g. lookahead[5] = Σ(UTXO[6+].amount)
    std::vector<CAmount> lookahead(utxo_pool.size());
    // The minimum UTXO weight among the remaining UTXOs after this UTXO index, e.g. min_tail_weight[5] = min(UTXO[6+].weight)
    std::vector<int> min_tail_weight(utxo_pool.size());

    // Calculate lookahead values, min_tail_weights, and check that there are sufficient funds
    CAmount total_available = 0;
    int min_group_weight = std::numeric_limits<int>::max();
    for (size_t i = 0; i < utxo_pool.size(); ++i) {
        size_t index = utxo_pool.size() - 1 - i; // Loop over every element in reverse order
        lookahead[index] = total_available;
        min_tail_weight[index] = min_group_weight;
        // UTXOs with non-positive effective value must have been filtered
        Assume(utxo_pool[index].GetSelectionAmount() > 0);
        total_available += utxo_pool[index].GetSelectionAmount();
        min_group_weight = std::min(min_group_weight, utxo_pool[index].m_weight);
    }

    const CAmount total_target = selection_target + change_target;
    if (total_available < total_target) {
        // Insufficient funds
        return util::Error();
    }

    // The current selection and the best input set found so far, stored as the utxo_pool indices of the UTXOs forming them
    std::vector<size_t> curr_selection;
    std::vector<size_t> best_selection;

    // The currently selected effective amount, and the effective amount of the best selection so far
    CAmount curr_amount = 0;
    CAmount best_selection_amount = MAX_MONEY;

    // The weight of the currently selected input set, and the weight of the best selection
    int curr_weight = 0;
    int best_selection_weight = max_selection_weight; // Tie is fine, because we prefer lower selection amount

    // Whether the input sets generated during this search have exceeded the maximum transaction weight at any point
    bool max_tx_weight_exceeded = false;

    // Index of the next UTXO to consider in utxo_pool
    size_t next_utxo = 0;

    /*
     * You can think of the current selection as a vector of booleans that has decided inclusion or exclusion of all
     * UTXOs before `next_utxo`. When we consider the next UTXO, we extend this hypothetical boolean vector either with
     * a true value if the UTXO is included or a false value if it is omitted. The equivalent state is stored more
     * compactly as the list of indices of the included UTXOs and the `next_utxo` index.
     *
     * We can never find a new solution by deselecting a UTXO, because we then revisit a previously evaluated
     * selection. Therefore, we only need to check whether we found a new solution _after adding_ a new UTXO.
     *
     * Each iteration of CoinGrinder starts by selecting the `next_utxo` and evaluating the current selection. We
     * use three state transitions to progress from the current selection to the next promising selection:
     *
     * - EXPLORE inclusion branch: We do not have sufficient funds, yet. Add `next_utxo` to the current selection, then
     *                             nominate the direct successor of the just selected UTXO as our `next_utxo` for the
     *                             following iteration.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: EXPLORE, next_utxo: 8
     *                                 Next Selection: {0, 5, 7, 8}
     *
     * - SHIFT to omission branch: Adding more UTXOs to the current selection cannot produce a solution that is better
     *                             than the current best, e.g. the current selection weight exceeds the max weight or
     *                             the current selection amount is equal to or greater than the target.
     *                             We designate our `next_utxo` the one after the tail of our current selection, then
     *                             deselect the tail of our current selection.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: SHIFT, next_utxo: 8, omit last selected: {0, 5}
     *                                 Next Selection: {0, 5, 8}
     *
     * - CUT entire subtree:       We have exhausted the inclusion branch for the penultimately selected UTXO, both the
     *                             inclusion and the omission branch of the current prefix are barren. E.g. we have
     *                             reached the end of the UTXO pool, so neither further EXPLORING nor SHIFTING can find
     *                             any solutions. We designate our `next_utxo` the one after our penultimate selected,
     *                             then deselect both the last and penultimate selected.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: CUT, next_utxo: 6, omit two last selected: {0}
     *                                 Next Selection: {0, 6}
     */
    auto deselect_last = [&]() {
        OutputGroup& utxo = utxo_pool[curr_selection.back()];
        curr_amount -= utxo.GetSelectionAmount();
        curr_weight -= utxo.m_weight;
        curr_selection.pop_back();
    };

    SelectionResult result(selection_target, SelectionAlgorithm::CG);
    bool is_done = false;
    size_t curr_try = 0;
    while (!is_done) {
        bool should_shift{false}, should_cut{false};
        // Select `next_utxo`
        OutputGroup& utxo = utxo_pool[next_utxo];
        curr_amount += utxo.GetSelectionAmount();
        curr_weight += utxo.m_weight;
        curr_selection.push_back(next_utxo);
        ++next_utxo;
        ++curr_try;

        // EVALUATE current selection: check for solutions and see whether we can CUT or SHIFT before EXPLORING further
        auto curr_tail = curr_selection.back();
        if (curr_amount + lookahead[curr_tail] < total_target) {
            // Insufficient funds with lookahead: CUT
            should_cut = true;
        } else if (curr_weight > best_selection_weight) {
            // best_selection_weight is initialized to max_selection_weight
            if (curr_weight > max_selection_weight) max_tx_weight_exceeded = true;
            // Worse weight than best solution. More UTXOs only increase weight:
            // CUT if last selected group had minimal weight, else SHIFT
            if (utxo_pool[curr_tail].m_weight <= min_tail_weight[curr_tail]) {
                should_cut = true;
            } else {
                should_shift  = true;
            }
        } else if (curr_amount >= total_target) {
            // Success, adding more weight cannot be better: SHIFT
            should_shift  = true;
            if (curr_weight < best_selection_weight || (curr_weight == best_selection_weight && curr_amount < best_selection_amount)) {
                // New lowest weight, or same weight with fewer funds tied up
                best_selection = curr_selection;
                best_selection_weight = curr_weight;
                best_selection_amount = curr_amount;
            }
        } else if (!best_selection.empty() && curr_weight + int64_t{min_tail_weight[curr_tail]} * ((total_target - curr_amount + utxo_pool[curr_tail].GetSelectionAmount() - 1) / utxo_pool[curr_tail].GetSelectionAmount()) > best_selection_weight) {
            // Compare minimal tail weight and last selected amount with the amount missing to gauge whether a better weight is still possible.
            if (utxo_pool[curr_tail].m_weight <= min_tail_weight[curr_tail]) {
                should_cut = true;
            } else {
                should_shift = true;
            }
        }

        if (curr_try >= TOTAL_TRIES) {
            // Solution is not guaranteed to be optimal if `curr_try` hit TOTAL_TRIES
            result.SetAlgoCompleted(false);
            break;
        }

        if (next_utxo == utxo_pool.size()) {
            // Last added UTXO was end of UTXO pool, nothing left to add on inclusion or omission branch: CUT
            should_cut = true;
        }

        if (should_cut) {
            // Neither adding to the current selection nor exploring the omission branch of the last selected UTXO can
            // find any solutions. Redirect to exploring the Omission branch of the penultimate selected UTXO (i.e.
            // set `next_utxo` to one after the penultimate selected, then deselect the last two selected UTXOs)
            should_cut = false;
            deselect_last();
            should_shift  = true;
        }

        while (should_shift) {
            // Set `next_utxo` to one after last selected, then deselect last selected UTXO
            if (curr_selection.empty()) {
                // Exhausted search space before running into attempt limit
                is_done = true;
                result.SetAlgoCompleted(true);
                break;
            }
            next_utxo = curr_selection.back() + 1;
            deselect_last();
            should_shift  = false;

            // After SHIFTing to an omission branch, the `next_utxo` might have the same effective value as the UTXO we
            // just omitted. Since lower weight is our tiebreaker on UTXOs with equal effective value for sorting, if it
            // ties on the effective value, it _must_ have the same weight (i.e. be a "clone" of the prior UTXO) or a
            // higher weight. If so, selecting `next_utxo` would produce an equivalent or worse selection as one we
            // previously evaluated. In that case, increment `next_utxo` until we find a UTXO with a differing amount.
            while (utxo_pool[next_utxo - 1].GetSelectionAmount() == utxo_pool[next_utxo].GetSelectionAmount()) {
                if (next_utxo >= utxo_pool.size() - 1) {
                    // Reached end of UTXO pool skipping clones: SHIFT instead
                    should_shift = true;
                    break;
                }
                // Skip clone: previous UTXO is equivalent and unselected
                ++next_utxo;
            }
        }
    }

    result.SetSelectionsEvaluated(curr_try);

    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool[i]);
    }

    return result;
}